

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderStructCase::init(ShaderStructCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Texture2D *tex2D;
  reference pvVar2;
  TextureBinding local_a0;
  int numTextures;
  WrapMode WStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  bool local_40;
  undefined8 local_3c;
  undefined1 auStack_34 [20];
  DepthStencilMode local_20;
  
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  if ((this->m_flags & 1) != 0) {
    tex2D = glu::Texture2D::create
                      ((this->super_ShaderRenderCase).m_renderCtx,
                       (this->super_ShaderRenderCase).m_ctxInfo,
                       ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->
                       m_curArchive,"data/brick.png");
    this->m_brickTexture = tex2D;
    numTextures = CLAMP_TO_EDGE;
    WStack_54 = CLAMP_TO_EDGE;
    uStack_50._0_4_ = CLAMP_TO_EDGE;
    uStack_50._4_4_ = LINEAR;
    local_48._0_4_ = LINEAR;
    local_48._4_4_ = 0.0;
    local_40 = true;
    local_20 = MODE_DEPTH;
    local_3c._0_4_ = COMPAREMODE_NONE;
    local_3c._4_4_ = 0;
    auStack_34[0] = 0;
    auStack_34._1_7_ = 0;
    auStack_34[8] = 0;
    auStack_34._9_8_ = 0;
    deqp::gls::TextureBinding::TextureBinding(&local_a0,tex2D,(Sampler *)&numTextures);
    pvVar2 = std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
             emplace_back<deqp::gls::TextureBinding>
                       (&(this->super_ShaderRenderCase).m_textures,&local_a0);
    iVar1 = (int)pvVar2;
  }
  return iVar1;
}

Assistant:

void ShaderStructCase::init (void)
{
	try
	{
		gls::ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (m_flags & FLAG_REQUIRES_DYNAMIC_LOOPS)
		{
			const bool isSupported = m_isVertexCase ? m_ctxInfo.isVertexDynamicLoopSupported() : m_ctxInfo.isFragmentDynamicLoopSupported();
			if (!isSupported)
				throw tcu::NotSupportedError("Dynamic loops not supported");
		}

		if ((m_flags && FLAG_USES_TEXTURES) && m_isVertexCase)
		{
			int numTextures = 0;
			m_renderCtx.getFunctions().getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &numTextures);
			if (numTextures == 0)
				throw tcu::NotSupportedError("Vertex shader texture access not supported");
		}

		if (m_flags & FLAG_REQUIRES_DYNAMIC_INDEXING)
			throw tcu::NotSupportedError("Dynamic indexing not supported");

		throw;
	}

	if (m_flags & FLAG_USES_TEXTURES)
	{
		m_brickTexture = glu::Texture2D::create(m_renderCtx, m_ctxInfo, m_testCtx.getArchive(), "data/brick.png");
		m_textures.push_back(TextureBinding(m_brickTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
																		 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
		DE_ASSERT(m_textures.size() == 1);
	}
}